

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

char * lj_strfmt_wstrnum(lua_State *L,cTValue *o,MSize *lenp)

{
  uint64_t uVar1;
  ulong uVar2;
  SBuf *pSVar3;
  SBufExt *sbx;
  SBuf *sb;
  MSize *lenp_local;
  cTValue *o_local;
  lua_State *L_local;
  SBuf *sb_1;
  
  if ((int)(o->field_4).it >> 0xf == -5) {
    *lenp = *(MSize *)((o->u64 & 0x7fffffffffff) + 0x14);
    L_local = (lua_State *)((o->u64 & 0x7fffffffffff) + 0x18);
  }
  else if (((int)(o->field_4).it >> 0xf == -0xd) &&
          (*(char *)((o->u64 & 0x7fffffffffff) + 10) == '\x03')) {
    uVar2 = o->u64 & 0x7fffffffffff;
    *lenp = (int)*(undefined8 *)(uVar2 + 0x30) - (int)*(undefined8 *)(uVar2 + 0x58);
    L_local = *(lua_State **)(uVar2 + 0x58);
  }
  else if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff2) {
    uVar1 = (L->glref).ptr64;
    *(lua_State **)(uVar1 + 0xe0) = L;
    ((SBuf *)(uVar1 + 200))->w = *(char **)(uVar1 + 0xd8);
    pSVar3 = lj_strfmt_putfnum((SBuf *)(uVar1 + 200),0xf000035,o->n);
    *lenp = (int)pSVar3->w - (int)pSVar3->b;
    L_local = (lua_State *)pSVar3->b;
  }
  else {
    L_local = (lua_State *)0x0;
  }
  return (char *)L_local;
}

Assistant:

const char *lj_strfmt_wstrnum(lua_State *L, cTValue *o, MSize *lenp)
{
  SBuf *sb;
  if (tvisstr(o)) {
    *lenp = strV(o)->len;
    return strVdata(o);
  } else if (tvisbuf(o)) {
    SBufExt *sbx = bufV(o);
    *lenp = sbufxlen(sbx);
    return sbx->r;
  } else if (tvisint(o)) {
    sb = lj_strfmt_putint(lj_buf_tmp_(L), intV(o));
  } else if (tvisnum(o)) {
    sb = lj_strfmt_putfnum(lj_buf_tmp_(L), STRFMT_G14, o->n);
  } else {
    return NULL;
  }
  *lenp = sbuflen(sb);
  return sb->b;
}